

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Level.h
# Opt level: O0

void __thiscall sortNode::sortNode(sortNode *this)

{
  sortNode *this_local;
  
  std::__cxx11::string::string((string *)&this->value);
  this->key = 0;
  std::__cxx11::string::operator=((string *)&this->value,"");
  this->timer = 0;
  this->del = false;
  return;
}

Assistant:

sortNode(){key=0;value="";timer=0;del= false;}